

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_strings.c
# Opt level: O0

int cubeb_strings_init(cubeb_strings **strings)

{
  undefined4 *puVar1;
  undefined8 *in_RDI;
  cubeb_strings *strs;
  int local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = -1;
  }
  else {
    puVar1 = (undefined4 *)calloc(1,0x30);
    if (puVar1 == (undefined4 *)0x0) {
      local_4 = -1;
    }
    else {
      *puVar1 = 4;
      puVar1[1] = 0;
      *(undefined4 **)(puVar1 + 2) = puVar1 + 4;
      *in_RDI = puVar1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
cubeb_strings_init(cubeb_strings ** strings)
{
  cubeb_strings * strs = NULL;

  if (!strings) {
    return CUBEB_ERROR;
  }

  strs = calloc(1, sizeof(cubeb_strings));
  assert(strs);

  if (!strs) {
    return CUBEB_ERROR;
  }

  strs->size = sizeof(strs->small_store) / sizeof(strs->small_store[0]);
  strs->count = 0;
  strs->data = strs->small_store;

  *strings = strs;

  return CUBEB_OK;
}